

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flow_cutter.h
# Opt level: O1

void flow_cutter::DistanceAwareCutter::
     compute_hop_distance_from<flow_cutter::Graph<flow_cutter::expanded_graph::Tail<ConstRefIDIDFunc<ArrayIDIDFunc>>,flow_cutter::expanded_graph::Head<ConstRefIDIDFunc<ArrayIDIDFunc>>,flow_cutter::expanded_graph::BackArc<ConstRefIDIDFunc<ArrayIDIDFunc>>,flow_cutter::expanded_graph::Capacity,flow_cutter::expanded_graph::OutArc<ConstRefIDFunc<RangeIDIDMultiFunc>>>>
               (Graph<flow_cutter::expanded_graph::Tail<ConstRefIDIDFunc<ArrayIDIDFunc>_>,_flow_cutter::expanded_graph::Head<ConstRefIDIDFunc<ArrayIDIDFunc>_>,_flow_cutter::expanded_graph::BackArc<ConstRefIDIDFunc<ArrayIDIDFunc>_>,_flow_cutter::expanded_graph::Capacity,_flow_cutter::expanded_graph::OutArc<ConstRefIDFunc<RangeIDIDMultiFunc>_>_>
                *graph,TemporaryData *tmp,int source,ArrayIDFunc<int> *dist)

{
  int *piVar1;
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  ulong uVar5;
  long lVar6;
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  BreadthFirstSearch local_14;
  anon_class_1_0_00000001 on_new_arc;
  anon_class_1_0_00000001 see_node;
  anon_class_1_0_00000001 was_node_seen;
  anon_class_16_2_f6f92433 should_follow_arc;
  
  piVar1 = dist->data_;
  if ((long)dist->preimage_count_ != 0) {
    uVar5 = (long)dist->preimage_count_ + 0x3fffffffffffffff;
    auVar7 = vpbroadcastq_avx512vl();
    lVar6 = 0;
    auVar2 = vpmovsxbq_avx2(ZEXT416(0x7060504));
    auVar3 = vpmovsxbq_avx2(ZEXT416(0x3020100));
    auVar9._8_4_ = 0x7fffffff;
    auVar9._0_8_ = 0x7fffffff7fffffff;
    auVar9._12_4_ = 0x7fffffff;
    auVar9._16_4_ = 0x7fffffff;
    auVar9._20_4_ = 0x7fffffff;
    auVar9._24_4_ = 0x7fffffff;
    auVar9._28_4_ = 0x7fffffff;
    do {
      auVar8 = vpbroadcastq_avx512vl();
      auVar4 = vpor_avx2(auVar8,auVar2);
      auVar8 = vpor_avx2(auVar8,auVar3);
      vpcmpuq_avx512vl(auVar8,auVar7,2);
      vpcmpuq_avx512vl(auVar4,auVar7,2);
      auVar4 = vmovdqu32_avx512vl(auVar9);
      *(undefined1 (*) [32])(piVar1 + lVar6) = auVar4;
      lVar6 = lVar6 + 8;
    } while (((uVar5 & 0x3fffffffffffffff) - (ulong)((uint)uVar5 & 7)) + 8 != lVar6);
  }
  piVar1[source] = 0;
  should_follow_arc.dist = dist;
  should_follow_arc.graph = graph;
  BreadthFirstSearch::operator()
            (&local_14,graph,tmp,source,&was_node_seen,&see_node,&should_follow_arc,&on_new_arc);
  return;
}

Assistant:

static void compute_hop_distance_from(const Graph& graph, TemporaryData& tmp,
        int source, ArrayIDFunc<int>& dist)
    {
        dist.fill(std::numeric_limits<int>::max());
        dist[source] = 0;

        auto was_node_seen = [&](int x) { return false; };
        auto see_node = [](int x) { return true; };
        auto should_follow_arc = [&](int xy) {
            if (dist(graph.tail(xy)) < dist(graph.head(xy)) - 1) {
                dist[graph.head(xy)] = dist(graph.tail(xy)) + 1;
                return true;
            } else {
                return false;
            }
        };
        auto on_new_arc = [&](int xy) {};
        BreadthFirstSearch()(graph, tmp, source, was_node_seen, see_node,
            should_follow_arc, on_new_arc);
    }